

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH_errorcode XXH32_reset(XXH32_state_t *statePtr,uint seed)

{
  int in_ESI;
  void *in_RDI;
  XXH32_state_t state;
  undefined1 local_3c [8];
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_c;
  void *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_3c,0,0x2c);
  local_34 = local_c + 0x24234428;
  local_30 = local_c + -0x7a143589;
  local_2c = local_c;
  local_28 = local_c + 0x61c8864f;
  memcpy(local_8,local_3c,0x30);
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH32_reset(XXH32_state_t* statePtr, unsigned int seed)
{
    XXH32_state_t state;   /* using a local state to memcpy() in order to avoid strict-aliasing warnings */
    memset(&state, 0, sizeof(state)-4);   /* do not write into reserved, for future removal */
    state.v1 = seed + PRIME32_1 + PRIME32_2;
    state.v2 = seed + PRIME32_2;
    state.v3 = seed + 0;
    state.v4 = seed - PRIME32_1;
    memcpy(statePtr, &state, sizeof(state));
    return XXH_OK;
}